

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzer.cpp
# Opt level: O1

void __thiscall SWDAnalyzer::~SWDAnalyzer(SWDAnalyzer *this)

{
  pointer pSVar1;
  SWDAnalyzerResults *pSVar2;
  
  *(undefined ***)this = &PTR__SWDAnalyzer_00111c98;
  Analyzer::KillThread();
  pSVar1 = (this->mSWDParser).mBitsBuffer.super__Vector_base<SWDBit,_std::allocator<SWDBit>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1);
  }
  SWDSimulationDataGenerator::~SWDSimulationDataGenerator(&this->mSimulationDataGenerator);
  pSVar2 = (this->mResults)._M_ptr;
  if (pSVar2 != (SWDAnalyzerResults *)0x0) {
    (**(code **)(*(long *)pSVar2 + 8))();
  }
  SWDAnalyzerSettings::~SWDAnalyzerSettings(&this->mSettings);
  Analyzer::~Analyzer((Analyzer *)this);
  return;
}

Assistant:

SWDAnalyzer::~SWDAnalyzer()
{
    KillThread();
}